

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SchemaInfo.hpp
# Opt level: O3

void __thiscall
xercesc_4_0::SchemaInfo::addSchemaInfo(SchemaInfo *this,SchemaInfo *toAdd,ListType aListType)

{
  MemoryManager *pMVar1;
  ulong uVar2;
  XMLSize_t XVar3;
  RefVectorOf<xercesc_4_0::SchemaInfo> *pRVar4;
  SchemaInfo **ppSVar5;
  XMLSize_t XVar6;
  ulong uVar7;
  int iVar8;
  XMLSize_t index;
  BaseRefVectorOf<xercesc_4_0::SchemaInfo> *pBVar9;
  undefined4 extraout_var;
  long lVar10;
  undefined4 extraout_var_00;
  SchemaInfo *pSVar11;
  RefVectorOf<xercesc_4_0::SchemaInfo> *pRVar12;
  ulong uVar13;
  XMLSize_t XVar14;
  
  if (aListType == IMPORT) {
    pBVar9 = &this->fImportedInfoList->super_BaseRefVectorOf<xercesc_4_0::SchemaInfo>;
    if (pBVar9 == (BaseRefVectorOf<xercesc_4_0::SchemaInfo> *)0x0) {
      pBVar9 = (BaseRefVectorOf<xercesc_4_0::SchemaInfo> *)
               XMemory::operator_new(0x30,this->fMemoryManager);
      pMVar1 = this->fMemoryManager;
      ((BaseRefVectorOf<xercesc_4_0::SchemaInfo> *)&pBVar9->_vptr_BaseRefVectorOf)->
      _vptr_BaseRefVectorOf = (_func_int **)&PTR__BaseRefVectorOf_0040f1c8;
      pBVar9->fAdoptedElems = false;
      pBVar9->fCurCount = 0;
      pBVar9->fMaxCount = 4;
      pBVar9->fElemList = (SchemaInfo **)0x0;
      pBVar9->fMemoryManager = pMVar1;
      iVar8 = (*pMVar1->_vptr_MemoryManager[3])(pMVar1,0x20);
      pBVar9->fElemList = (SchemaInfo **)CONCAT44(extraout_var,iVar8);
      lVar10 = 0;
      do {
        pBVar9->fElemList[lVar10] = (SchemaInfo *)0x0;
        lVar10 = lVar10 + 1;
      } while (lVar10 != 4);
      ((BaseRefVectorOf<xercesc_4_0::SchemaInfo> *)&pBVar9->_vptr_BaseRefVectorOf)->
      _vptr_BaseRefVectorOf = (_func_int **)&PTR__RefVectorOf_0040f150;
      this->fImportedInfoList = (RefVectorOf<xercesc_4_0::SchemaInfo> *)pBVar9;
    }
    uVar2 = pBVar9->fCurCount;
    if (uVar2 != 0) {
      if (*pBVar9->fElemList == toAdd) {
        return;
      }
      uVar7 = 1;
      do {
        uVar13 = uVar7;
        if (uVar2 == uVar13) break;
        uVar7 = uVar13 + 1;
      } while (pBVar9->fElemList[uVar13] != toAdd);
      if (uVar13 < uVar2) {
        return;
      }
    }
    BaseRefVectorOf<xercesc_4_0::SchemaInfo>::ensureExtraCapacity(pBVar9,1);
    XVar3 = pBVar9->fCurCount;
    pBVar9->fElemList[XVar3] = toAdd;
    pBVar9->fCurCount = XVar3 + 1;
    updateImportingInfo(toAdd,this);
    return;
  }
  pBVar9 = &this->fIncludeInfoList->super_BaseRefVectorOf<xercesc_4_0::SchemaInfo>;
  if (pBVar9 == (BaseRefVectorOf<xercesc_4_0::SchemaInfo> *)0x0) {
    pBVar9 = (BaseRefVectorOf<xercesc_4_0::SchemaInfo> *)
             XMemory::operator_new(0x30,this->fMemoryManager);
    pMVar1 = this->fMemoryManager;
    ((BaseRefVectorOf<xercesc_4_0::SchemaInfo> *)&pBVar9->_vptr_BaseRefVectorOf)->
    _vptr_BaseRefVectorOf = (_func_int **)&PTR__BaseRefVectorOf_0040f1c8;
    pBVar9->fAdoptedElems = false;
    pBVar9->fCurCount = 0;
    pBVar9->fMaxCount = 8;
    pBVar9->fElemList = (SchemaInfo **)0x0;
    pBVar9->fMemoryManager = pMVar1;
    iVar8 = (*pMVar1->_vptr_MemoryManager[3])(pMVar1,0x40);
    pBVar9->fElemList = (SchemaInfo **)CONCAT44(extraout_var_00,iVar8);
    lVar10 = 0;
    do {
      pBVar9->fElemList[lVar10] = (SchemaInfo *)0x0;
      lVar10 = lVar10 + 1;
    } while (lVar10 != 8);
    ((BaseRefVectorOf<xercesc_4_0::SchemaInfo> *)&pBVar9->_vptr_BaseRefVectorOf)->
    _vptr_BaseRefVectorOf = (_func_int **)&PTR__RefVectorOf_0040f150;
    this->fIncludeInfoList = (RefVectorOf<xercesc_4_0::SchemaInfo> *)pBVar9;
    this->fAdoptInclude = true;
  }
  uVar2 = pBVar9->fCurCount;
  if (uVar2 != 0) {
    if (*pBVar9->fElemList == toAdd) {
      return;
    }
    uVar7 = 1;
    do {
      uVar13 = uVar7;
      if (uVar2 == uVar13) break;
      uVar7 = uVar13 + 1;
    } while (pBVar9->fElemList[uVar13] != toAdd);
    if (uVar13 < uVar2) {
      return;
    }
  }
  BaseRefVectorOf<xercesc_4_0::SchemaInfo>::ensureExtraCapacity(pBVar9,1);
  XVar3 = pBVar9->fCurCount;
  pBVar9->fElemList[XVar3] = toAdd;
  pBVar9->fCurCount = XVar3 + 1;
  pRVar4 = toAdd->fIncludeInfoList;
  pRVar12 = this->fIncludeInfoList;
  if (pRVar4 == (RefVectorOf<xercesc_4_0::SchemaInfo> *)0x0) {
    toAdd->fIncludeInfoList = pRVar12;
  }
  else if (pRVar4 != pRVar12) {
    XVar3 = (pRVar4->super_BaseRefVectorOf<xercesc_4_0::SchemaInfo>).fCurCount;
    if (XVar3 != 0) {
      XVar14 = 0;
      do {
        pRVar4 = this->fIncludeInfoList;
        pSVar11 = BaseRefVectorOf<xercesc_4_0::SchemaInfo>::elementAt
                            (&toAdd->fIncludeInfoList->
                              super_BaseRefVectorOf<xercesc_4_0::SchemaInfo>,XVar14);
        uVar2 = (pRVar4->super_BaseRefVectorOf<xercesc_4_0::SchemaInfo>).fCurCount;
        if (uVar2 == 0) {
LAB_003356a7:
          pBVar9 = &this->fIncludeInfoList->super_BaseRefVectorOf<xercesc_4_0::SchemaInfo>;
          pSVar11 = BaseRefVectorOf<xercesc_4_0::SchemaInfo>::elementAt
                              (&toAdd->fIncludeInfoList->
                                super_BaseRefVectorOf<xercesc_4_0::SchemaInfo>,XVar14);
          BaseRefVectorOf<xercesc_4_0::SchemaInfo>::ensureExtraCapacity(pBVar9,1);
          XVar6 = pBVar9->fCurCount;
          pBVar9->fElemList[XVar6] = pSVar11;
          pBVar9->fCurCount = XVar6 + 1;
        }
        else {
          ppSVar5 = (pRVar4->super_BaseRefVectorOf<xercesc_4_0::SchemaInfo>).fElemList;
          if (*ppSVar5 != pSVar11) {
            uVar7 = 1;
            do {
              uVar13 = uVar7;
              if (uVar2 == uVar13) break;
              uVar7 = uVar13 + 1;
            } while (ppSVar5[uVar13] != pSVar11);
            if (uVar2 <= uVar13) goto LAB_003356a7;
          }
        }
        XVar14 = XVar14 + 1;
      } while (XVar14 != XVar3);
      pRVar12 = this->fIncludeInfoList;
    }
    XVar3 = (pRVar12->super_BaseRefVectorOf<xercesc_4_0::SchemaInfo>).fCurCount;
    if (XVar3 != 0) {
      XVar14 = 0;
      do {
        pRVar4 = toAdd->fIncludeInfoList;
        pSVar11 = BaseRefVectorOf<xercesc_4_0::SchemaInfo>::elementAt
                            (&this->fIncludeInfoList->super_BaseRefVectorOf<xercesc_4_0::SchemaInfo>
                             ,XVar14);
        uVar2 = (pRVar4->super_BaseRefVectorOf<xercesc_4_0::SchemaInfo>).fCurCount;
        if (uVar2 == 0) {
LAB_00335739:
          pBVar9 = &toAdd->fIncludeInfoList->super_BaseRefVectorOf<xercesc_4_0::SchemaInfo>;
          pSVar11 = BaseRefVectorOf<xercesc_4_0::SchemaInfo>::elementAt
                              (&this->fIncludeInfoList->
                                super_BaseRefVectorOf<xercesc_4_0::SchemaInfo>,XVar14);
          BaseRefVectorOf<xercesc_4_0::SchemaInfo>::ensureExtraCapacity(pBVar9,1);
          XVar6 = pBVar9->fCurCount;
          pBVar9->fElemList[XVar6] = pSVar11;
          pBVar9->fCurCount = XVar6 + 1;
        }
        else {
          ppSVar5 = (pRVar4->super_BaseRefVectorOf<xercesc_4_0::SchemaInfo>).fElemList;
          if (*ppSVar5 != pSVar11) {
            uVar7 = 1;
            do {
              uVar13 = uVar7;
              if (uVar2 == uVar13) break;
              uVar7 = uVar13 + 1;
            } while (ppSVar5[uVar13] != pSVar11);
            if (uVar2 <= uVar13) goto LAB_00335739;
          }
        }
        XVar14 = XVar14 + 1;
      } while (XVar14 != XVar3);
    }
  }
  return;
}

Assistant:

inline void SchemaInfo::addSchemaInfo(SchemaInfo* const toAdd,
                                      const ListType aListType) {

    if (aListType == IMPORT) {

        if (!fImportedInfoList)
            fImportedInfoList = new (fMemoryManager) RefVectorOf<SchemaInfo>(4, false, fMemoryManager);

        if (!fImportedInfoList->containsElement(toAdd)) {

            fImportedInfoList->addElement(toAdd);
            toAdd->updateImportingInfo(this);
        }
    }
    else {

        if (!fIncludeInfoList) {

            fIncludeInfoList = new (fMemoryManager) RefVectorOf<SchemaInfo>(8, false, fMemoryManager);
            fAdoptInclude = true;
        }

        if (!fIncludeInfoList->containsElement(toAdd)) {

		    fIncludeInfoList->addElement(toAdd);
            //code was originally:
            //toAdd->fIncludeInfoList = fIncludeInfoList;
            //however for handling multiple imports this was causing
            //to schemaInfo's to have the same fIncludeInfoList which they
            //both owned so when it was deleted it crashed.
			if (toAdd->fIncludeInfoList) {
			   if (toAdd->fIncludeInfoList != fIncludeInfoList) {
                   XMLSize_t size = toAdd->fIncludeInfoList->size();
                   for (XMLSize_t i=0; i<size; i++) {
                       if (!fIncludeInfoList->containsElement(toAdd->fIncludeInfoList->elementAt(i))) {
                            fIncludeInfoList->addElement(toAdd->fIncludeInfoList->elementAt(i));
                       }
                   }
                   size = fIncludeInfoList->size();
                   for (XMLSize_t j=0; j<size; j++) {
                       if (!toAdd->fIncludeInfoList->containsElement(fIncludeInfoList->elementAt(j))) {
                            toAdd->fIncludeInfoList->addElement(fIncludeInfoList->elementAt(j));
                       }
                   }
			   }
			}
			else {
				toAdd->fIncludeInfoList = fIncludeInfoList;
			}
        }
    }
}